

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_q6_K(block_q6_K *x,float *y,int64_t k)

{
  float fVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  int l;
  ulong uVar6;
  long lVar7;
  block_q6_K *pbVar8;
  uint8_t *puVar9;
  int8_t *piVar10;
  int n;
  uint uVar11;
  ulong uVar12;
  
  lVar7 = 0;
  lVar5 = k / 0x100;
  if (k / 0x100 < 1) {
    lVar5 = lVar7;
  }
  for (; lVar7 != lVar5; lVar7 = lVar7 + 1) {
    pbVar8 = x + lVar7;
    puVar9 = x[lVar7].qh;
    fVar1 = ggml_table_f32_f16[x[lVar7].d];
    piVar10 = x[lVar7].scales;
    for (uVar11 = 0; uVar11 < 0x100; uVar11 = uVar11 + 0x80) {
      for (uVar6 = 0; uVar6 != 0x20; uVar6 = uVar6 + 1) {
        uVar12 = uVar6 >> 4 & 0xfffffff;
        bVar2 = pbVar8->ql[uVar6];
        bVar3 = pbVar8->ql[uVar6 + 0x20];
        bVar4 = puVar9[uVar6];
        y[uVar6] = (float)(int)(char)(((bVar4 & 3) << 4 | bVar2 & 0xf) - 0x20) *
                   (float)(int)piVar10[uVar12] * fVar1;
        y[uVar6 + 0x20] =
             (float)(int)(char)((bVar4 * '\x04' & 0x30 | bVar3 & 0xf) - 0x20) *
             (float)(int)piVar10[uVar12 + 2] * fVar1;
        y[uVar6 + 0x40] =
             (float)(int)(char)((bVar4 & 0x30 | bVar2 >> 4) - 0x20) *
             (float)(int)piVar10[uVar12 + 4] * fVar1;
        y[uVar6 + 0x60] =
             (float)(int)(char)((bVar4 >> 2 & 0x30 | bVar3 >> 4) - 0x20) *
             (float)(int)piVar10[uVar12 + 6] * fVar1;
      }
      y = y + 0x80;
      pbVar8 = (block_q6_K *)(pbVar8->ql + 0x40);
      puVar9 = puVar9 + 0x20;
      piVar10 = piVar10 + 8;
    }
  }
  return;
}

Assistant:

void dequantize_row_q6_K(const block_q6_K * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {
        const float d = GGML_FP16_TO_FP32(x[i].d);

        const uint8_t * GGML_RESTRICT ql = x[i].ql;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const int8_t  * GGML_RESTRICT sc = x[i].scales;

        for (int n = 0; n < QK_K; n += 128) {
            for (int l = 0; l < 32; ++l) {
                int is = l/16;
                const int8_t q1 = (int8_t)((ql[l +  0] & 0xF) | (((qh[l] >> 0) & 3) << 4)) - 32;
                const int8_t q2 = (int8_t)((ql[l + 32] & 0xF) | (((qh[l] >> 2) & 3) << 4)) - 32;
                const int8_t q3 = (int8_t)((ql[l +  0]  >> 4) | (((qh[l] >> 4) & 3) << 4)) - 32;
                const int8_t q4 = (int8_t)((ql[l + 32]  >> 4) | (((qh[l] >> 6) & 3) << 4)) - 32;
                y[l +  0] = d * sc[is + 0] * q1;
                y[l + 32] = d * sc[is + 2] * q2;
                y[l + 64] = d * sc[is + 4] * q3;
                y[l + 96] = d * sc[is + 6] * q4;
            }
            y  += 128;
            ql += 64;
            qh += 32;
            sc += 8;
        }
    }
}